

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O1

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateFragSizeAtReference
          (BuiltInsValidator *this,Decoration *decoration,Instruction *built_in_inst,
          Instruction *referenced_inst,Instruction *referenced_from_inst)

{
  uint32_t operand;
  _Rb_tree_color execution_model;
  bool bVar1;
  StorageClass SVar2;
  spv_result_t sVar3;
  long lVar4;
  DiagnosticStream *pDVar5;
  _Base_ptr p_Var6;
  list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
  *__position;
  undefined8 *puVar7;
  uint32_t vuid;
  spv_result_t unaff_R15D;
  uint32_t vuid_1;
  uint32_t uVar8;
  bool bVar9;
  spv_operand_desc desc;
  undefined1 local_2a0 [32];
  Instruction *local_280;
  _Any_data local_278;
  code *local_268;
  code *pcStack_260;
  string local_258;
  _Rb_tree_node_base *local_238;
  string local_230;
  char *local_210;
  code *local_208;
  undefined8 uStack_200;
  _Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
  local_1f8;
  BuiltInsValidator *local_c0;
  
  local_280 = referenced_inst;
  bVar1 = spvIsVulkanEnv(this->_->context_->target_env);
  if (bVar1) {
    if (decoration->dec_type_ != BuiltIn) {
      __assert_fail("dec_type_ == spv::Decoration::BuiltIn",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/decoration.h"
                    ,0x4f,"spv::BuiltIn spvtools::val::Decoration::builtin() const");
    }
    operand = *(decoration->params_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
               ._M_impl.super__Vector_impl_data._M_start;
    SVar2 = GetStorageClass(referenced_from_inst);
    if ((SVar2 == Input) || (SVar2 == Max)) {
      p_Var6 = (this->execution_models_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_238 = &(this->execution_models_)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (p_Var6 == local_238) {
        bVar1 = true;
      }
      else {
        do {
          execution_model = p_Var6[1]._M_color;
          bVar1 = execution_model == 4;
          if (!bVar1) {
            uVar8 = 0;
            lVar4 = 4;
            do {
              if (*(uint32_t *)((long)&UINT_007b761c + lVar4) == operand) {
                uVar8 = *(uint32_t *)((long)&(anonymous_namespace)::builtinVUIDInfo + lVar4);
                break;
              }
              bVar9 = lVar4 != 0x274;
              lVar4 = lVar4 + 0x10;
            } while (bVar9);
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_208,this->_,SPV_ERROR_INVALID_DATA,
                       referenced_from_inst);
            ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_278,this->_,uVar8,(char *)0x0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,(char *)local_278._M_unused._0_8_,local_278._8_8_);
            spvLogStringForEnv_abi_cxx11_(&local_258,this->_->context_->target_env);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,
                       (char *)CONCAT44(local_258._M_dataplus._M_p._4_4_,
                                        (uint32_t)local_258._M_dataplus._M_p),
                       local_258._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208," spec allows BuiltIn ",0x15);
            local_2a0._0_8_ = (spv_operand_desc)0x0;
            sVar3 = AssemblyGrammar::lookupOperand
                              (&this->_->grammar_,SPV_OPERAND_TYPE_BUILT_IN,operand,
                               (spv_operand_desc *)local_2a0);
            local_230._M_dataplus._M_p = "Unknown";
            if ((spv_operand_desc)local_2a0._0_8_ != (spv_operand_desc)0x0 && sVar3 == SPV_SUCCESS)
            {
              local_230._M_dataplus._M_p = *(pointer *)local_2a0._0_8_;
            }
            pDVar5 = DiagnosticStream::operator<<
                               ((DiagnosticStream *)&local_208,(char **)&local_230);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar5," to be used only with Fragment execution model. ",0x30);
            (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                      ((string *)local_2a0,this,decoration,built_in_inst,local_280,
                       referenced_from_inst,execution_model);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar5,(char *)local_2a0._0_8_,local_2a0._8_8_);
            unaff_R15D = pDVar5->error_;
            if ((spv_operand_desc)local_2a0._0_8_ != (spv_operand_desc)(local_2a0 + 0x10)) {
              operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_258._M_dataplus._M_p._4_4_,(uint32_t)local_258._M_dataplus._M_p)
                != &local_258.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_258._M_dataplus._M_p._4_4_,
                                       (uint32_t)local_258._M_dataplus._M_p),
                              local_258.field_2._M_allocated_capacity + 1);
            }
            if ((code **)local_278._M_unused._0_8_ != &local_268) {
              operator_delete(local_278._M_unused._M_object,(ulong)(local_268 + 1));
            }
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_208);
          }
        } while ((execution_model == 4) &&
                (p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6), p_Var6 != local_238));
      }
    }
    else {
      uVar8 = 0;
      lVar4 = 8;
      do {
        if (*(uint32_t *)((long)&UINT_007b7618 + lVar4) == operand) {
          uVar8 = *(uint32_t *)((long)&(anonymous_namespace)::builtinVUIDInfo + lVar4);
          break;
        }
        bVar1 = lVar4 != 0x278;
        lVar4 = lVar4 + 0x10;
      } while (bVar1);
      ValidationState_t::diag
                ((DiagnosticStream *)&local_208,this->_,SPV_ERROR_INVALID_DATA,referenced_from_inst)
      ;
      ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_278,this->_,uVar8,(char *)0x0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,(char *)local_278._M_unused._0_8_,local_278._8_8_);
      spvLogStringForEnv_abi_cxx11_(&local_258,this->_->context_->target_env);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,
                 (char *)CONCAT44(local_258._M_dataplus._M_p._4_4_,
                                  (uint32_t)local_258._M_dataplus._M_p),local_258._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208," spec allows BuiltIn ",0x15);
      local_2a0._0_8_ = (spv_operand_desc)0x0;
      sVar3 = AssemblyGrammar::lookupOperand
                        (&this->_->grammar_,SPV_OPERAND_TYPE_BUILT_IN,operand,
                         (spv_operand_desc *)local_2a0);
      if ((spv_operand_desc)local_2a0._0_8_ == (spv_operand_desc)0x0 || sVar3 != SPV_SUCCESS) {
        local_210 = "Unknown";
      }
      else {
        local_210 = *(char **)local_2a0._0_8_;
      }
      pDVar5 = DiagnosticStream::operator<<((DiagnosticStream *)&local_208,&local_210);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar5," to be only used for variables with Input storage class. ",0x39)
      ;
      (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                ((string *)local_2a0,this,decoration,built_in_inst,local_280,referenced_from_inst,
                 ExecutionModelMax);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar5,(char *)local_2a0._0_8_,local_2a0._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar5," ",1);
      (anonymous_namespace)::BuiltInsValidator::GetStorageClassDesc_abi_cxx11_
                (&local_230,this,referenced_from_inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar5,local_230._M_dataplus._M_p,local_230._M_string_length);
      unaff_R15D = pDVar5->error_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if ((spv_operand_desc)local_2a0._0_8_ != (spv_operand_desc)(local_2a0 + 0x10)) {
        operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_258._M_dataplus._M_p._4_4_,(uint32_t)local_258._M_dataplus._M_p) !=
          &local_258.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_258._M_dataplus._M_p._4_4_,
                                 (uint32_t)local_258._M_dataplus._M_p),
                        local_258.field_2._M_allocated_capacity + 1);
      }
      if ((code **)local_278._M_unused._0_8_ != &local_268) {
        operator_delete(local_278._M_unused._M_object,(ulong)(local_268 + 1));
      }
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_208);
      bVar1 = false;
    }
    if (!bVar1) {
      return unaff_R15D;
    }
  }
  if (this->function_id_ == 0) {
    local_258._M_dataplus._M_p._0_4_ = (referenced_from_inst->inst_).result_id;
    __position = (list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
                  *)std::
                    map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
                    ::operator[](&this->id_to_at_reference_checks_,(key_type *)&local_258);
    local_208 = ValidateFragSizeAtReference;
    uStack_200 = 0;
    std::
    _Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
    ::_Tuple_impl(&local_1f8,decoration,built_in_inst,referenced_from_inst,
                  (_Placeholder<1> *)&std::placeholders::_1);
    local_278._M_unused._M_object = (void *)0x0;
    local_278._8_8_ = 0;
    local_268 = (code *)0x0;
    pcStack_260 = (code *)0x0;
    local_c0 = this;
    puVar7 = (undefined8 *)operator_new(0x150);
    *puVar7 = local_208;
    puVar7[1] = uStack_200;
    std::
    _Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
    ::_Tuple_impl((_Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                   *)(puVar7 + 2),&local_1f8);
    puVar7[0x29] = local_c0;
    pcStack_260 = std::
                  _Function_handler<spv_result_t_(const_spvtools::val::Instruction_&),_std::_Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>_>
                  ::_M_invoke;
    local_268 = std::
                _Function_handler<spv_result_t_(const_spvtools::val::Instruction_&),_std::_Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>_>
                ::_M_manager;
    local_278._M_unused._M_object = puVar7;
    std::__cxx11::
    list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
    ::_M_insert<std::function<spv_result_t(spvtools::val::Instruction_const&)>>
              (__position,(iterator)__position,
               (function<spv_result_t_(const_spvtools::val::Instruction_&)> *)&local_278);
    if (local_268 != (code *)0x0) {
      (*local_268)(&local_278,&local_278,3);
    }
    if (local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>._M_head_impl.params_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>._M_head_impl
                      .params_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>.
                            _M_head_impl.params_.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>.
                            _M_head_impl.params_.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
        super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
                      super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            uses_.
                            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            uses_.
                            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.operands_.
        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                      operands_.
                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            operands_.
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            operands_.
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
        super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
        super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
                      super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
                      super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            uses_.
                            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            uses_.
                            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
        super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.operands_.
        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
                      super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                      operands_.
                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            operands_.
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            operands_.
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
        super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
                      super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateFragSizeAtReference(
    const Decoration& decoration, const Instruction& built_in_inst,
    const Instruction& referenced_inst,
    const Instruction& referenced_from_inst) {

  if (spvIsVulkanEnv(_.context()->target_env)) {
    const spv::BuiltIn builtin = decoration.builtin();
    const spv::StorageClass storage_class = GetStorageClass(referenced_from_inst);
    if (storage_class != spv::StorageClass::Max &&
        storage_class != spv::StorageClass::Input) {
      uint32_t vuid = GetVUIDForBuiltin(builtin, VUIDErrorStorageClass);
      return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
             << _.VkErrorID(vuid) << spvLogStringForEnv(_.context()->target_env)
             << " spec allows BuiltIn "
             << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN, uint32_t(builtin))
             << " to be only used for variables with Input storage class. "
             << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                 referenced_from_inst)
             << " " << GetStorageClassDesc(referenced_from_inst);
    }

    for (const spv::ExecutionModel execution_model : execution_models_) {
      if (execution_model != spv::ExecutionModel::Fragment) {
        uint32_t vuid = GetVUIDForBuiltin(builtin, VUIDErrorExecutionModel);
        return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
               << _.VkErrorID(vuid)
               << spvLogStringForEnv(_.context()->target_env)
               << " spec allows BuiltIn "
               << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN, uint32_t(builtin))
               << " to be used only with Fragment execution model. "
               << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                   referenced_from_inst, execution_model);
      }
    }
  }

  if (function_id_ == 0) {
    // Propagate this rule to all dependant ids in the global scope.
    id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
        &BuiltInsValidator::ValidateFragSizeAtReference, this, decoration,
        built_in_inst, referenced_from_inst, std::placeholders::_1));
  }

  return SPV_SUCCESS;
}